

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

RawHeadersList * __thiscall QNetworkHeadersPrivate::allRawHeaders(QNetworkHeadersPrivate *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->rawHeaderCache).isCached == false) {
    fromHttpToRaw((RawHeadersList *)&local_30,&this->httpHeaders);
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::operator=
              ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,&local_30);
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer(&local_30);
    (this->rawHeaderCache).isCached = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (RawHeadersList *)this;
  }
  __stack_chk_fail();
}

Assistant:

const QNetworkHeadersPrivate::RawHeadersList &QNetworkHeadersPrivate::allRawHeaders() const
{
    if (rawHeaderCache.isCached)
        return rawHeaderCache.headersList;

    rawHeaderCache.headersList = fromHttpToRaw(httpHeaders);
    rawHeaderCache.isCached = true;
    return rawHeaderCache.headersList;
}